

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_benchmark.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_68ba::Benchmark::Test(Benchmark *this,string *filename)

{
  Util *this_00;
  uint *puVar1;
  bool bVar2;
  bool bVar3;
  uint64_t seed;
  pointer pcVar4;
  pointer pcVar5;
  pointer pSVar6;
  pointer pcVar7;
  pointer pcVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  long *plVar11;
  char cVar12;
  uint uVar13;
  uint32_t uVar14;
  istream *piVar15;
  long lVar16;
  ostream *poVar17;
  size_t sVar18;
  char *pcVar19;
  int *piVar20;
  long lVar21;
  size_t sVar22;
  size_t sVar23;
  pointer pSVar24;
  int i;
  long lVar25;
  ulong uVar26;
  int iVar27;
  ulong uVar28;
  long lVar29;
  uint uVar30;
  char *pcVar31;
  char *pcVar32;
  ulong uVar33;
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar36 [64];
  undefined1 in_ZMM3 [64];
  double dVar37;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM6_Qb;
  size_t puzzle_guesses;
  long *local_4f8 [2];
  long local_4e8 [2];
  char puzzle_output [81];
  vector<int,_std::allocator<int>_> perm;
  long *local_458 [2];
  long local_448 [2];
  ifstream file;
  int iStack_434;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 uStack_420;
  undefined8 uStack_418;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined4 uStack_400;
  undefined4 uStack_3fc;
  undefined4 uStack_3f8;
  undefined8 uStack_3f4;
  undefined8 uStack_3ec;
  undefined8 uStack_3e4;
  undefined8 uStack_3dc;
  undefined8 uStack_3d4;
  int local_3cc [231];
  
  seed = (this->options_).random_seed;
  if (seed != 0) {
    Util::RandomSeed(&this->util,seed);
  }
  std::ifstream::ifstream((string *)&file);
  std::ifstream::open((string *)&file,(_Ios_Openmode)filename);
  if ((*(byte *)((long)&uStack_418 + *(long *)(_file + -0x18)) & 5) != 0) {
LAB_00105104:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Error opening ",0xe);
    poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(filename->_M_dataplus)._M_p,
                         filename->_M_string_length);
    std::endl<char,std::char_traits<char>>(poVar17);
    exit(1);
  }
  this->allow_zero_ = false;
  std::vector<char,_std::allocator<char>_>::resize
            (&this->dataset_,this->puzzle_buf_size_ * (this->options_).test_dataset_size);
  pcVar4 = (this->dataset_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar5 = (this->dataset_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pcVar4 != pcVar5) {
    memset(pcVar4,0,(long)pcVar5 - (long)pcVar4);
  }
  puzzle_output._0_8_ = puzzle_output + 0x10;
  this_00 = &this->util;
  uVar28 = 0;
  uVar13 = 0;
  puzzle_output[8] = '\0';
  puzzle_output[9] = '\0';
  puzzle_output[10] = '\0';
  puzzle_output[0xb] = '\0';
  puzzle_output[0xc] = '\0';
  puzzle_output[0xd] = '\0';
  puzzle_output[0xe] = '\0';
  puzzle_output[0xf] = '\0';
  puzzle_output[0x10] = '\0';
  do {
    uVar30 = (uint)uVar28;
LAB_0010468d:
    cVar12 = std::ios::widen((char)*(undefined8 *)(_file + -0x18) + (char)(string *)&file);
    piVar15 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)&file,(string *)puzzle_output,cVar12);
    if (((byte)piVar15[*(long *)(*(long *)piVar15 + -0x18) + 0x20] & 5) != 0) {
      std::ifstream::close();
      uVar28 = (this->options_).test_dataset_size;
      if ((uVar30 == uVar13) &&
         (uVar26 = (ulong)(int)(uVar13 * 2), uVar30 = uVar13, uVar26 < uVar28)) {
        do {
          pcVar4 = (this->dataset_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar16 = (long)(int)uVar30;
          memcpy(pcVar4 + this->puzzle_buf_size_ * lVar16,pcVar4,
                 this->puzzle_buf_size_ * (long)(int)uVar13);
          uVar28 = (ulong)uVar13;
          if ((0 < (int)uVar13 & (this->options_).randomize) == 1) {
            do {
              Util::PermuteSudoku(this_00,(this->dataset_).
                                          super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                          super__Vector_impl_data._M_start +
                                          this->puzzle_buf_size_ * lVar16,
                                  (this->options_).pencilmark);
              lVar16 = lVar16 + 1;
              uVar28 = uVar28 - 1;
            } while (uVar28 != 0);
          }
          uVar28 = (this->options_).test_dataset_size;
          uVar26 = uVar26 + (long)(int)uVar13;
          uVar30 = uVar30 + uVar13;
        } while (uVar26 < uVar28);
      }
      uVar26 = (ulong)(int)uVar30;
      if (uVar26 < uVar28) {
        do {
          uVar14 = Util::RandomUInt(this_00);
          pcVar4 = (this->dataset_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          strncpy(pcVar4 + this->puzzle_buf_size_ * uVar26,
                  pcVar4 + this->puzzle_buf_size_ * ((ulong)uVar14 % (ulong)uVar30),
                  this->puzzle_size_);
          if ((this->options_).randomize == true) {
            Util::PermuteSudoku(this_00,(this->dataset_).
                                        super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                        super__Vector_impl_data._M_start +
                                        this->puzzle_buf_size_ * uVar26,(this->options_).pencilmark)
            ;
          }
          uVar26 = uVar26 + 1;
        } while (uVar26 < (this->options_).test_dataset_size);
      }
      if ((char *)puzzle_output._0_8_ != puzzle_output + 0x10) {
        operator_delete((void *)puzzle_output._0_8_,
                        CONCAT71(puzzle_output._17_7_,puzzle_output[0x10]) + 1);
      }
      std::ifstream::~ifstream(&file);
      if ((this->options_).csv_output == false) {
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
        std::ostream::put('0');
        poVar17 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,"|",1);
        lVar16 = *(long *)poVar17;
        lVar25 = *(long *)(lVar16 + -0x18);
        *(uint *)(poVar17 + lVar25 + 0x18) = *(uint *)(poVar17 + lVar25 + 0x18) & 0xffffff4f | 0x20;
        *(undefined8 *)(poVar17 + *(long *)(lVar16 + -0x18) + 0x10) = 0x25;
        poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar17,(filename->_M_dataplus)._M_p,filename->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "|  puzzles/sec|  usec/puzzle|   %no_guess|  guesses/puzzle|",0x3b);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
        std::ostream::put('0');
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "|--------------------------------------|------------:|------------:|-----------:|---------------:|"
                   ,0x62);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
        std::ostream::put('0');
        std::ostream::flush();
      }
      Util::Permutation(&perm,this_00,(this->options_).test_dataset_size);
      pSVar24 = (this->options_).solvers.super__Vector_base<Solver,_std::allocator<Solver>_>._M_impl
                .super__Vector_impl_data._M_start;
      pSVar6 = (this->options_).solvers.super__Vector_base<Solver,_std::allocator<Solver>_>._M_impl.
               super__Vector_impl_data._M_finish;
      do {
        if (pSVar24 == pSVar6) {
          if (perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start != (pointer)0x0) {
            operator_delete(perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          return;
        }
        puzzle_output[0x40] = '\0';
        puzzle_output[0x41] = '\0';
        puzzle_output[0x42] = '\0';
        puzzle_output[0x43] = '\0';
        puzzle_output[0x44] = '\0';
        puzzle_output[0x45] = '\0';
        puzzle_output[0x46] = '\0';
        puzzle_output[0x47] = '\0';
        puzzle_output[0x48] = '\0';
        puzzle_output[0x49] = '\0';
        puzzle_output[0x4a] = '\0';
        puzzle_output[0x4b] = '\0';
        puzzle_output[0x4c] = '\0';
        puzzle_output[0x4d] = '\0';
        puzzle_output[0x4e] = '\0';
        puzzle_output[0x4f] = '\0';
        puzzle_output[0x50] = '\0';
        puzzle_output[0] = '\0';
        puzzle_output[1] = '\0';
        puzzle_output[2] = '\0';
        puzzle_output[3] = '\0';
        puzzle_output[4] = '\0';
        puzzle_output[5] = '\0';
        puzzle_output[6] = '\0';
        puzzle_output[7] = '\0';
        puzzle_output[8] = '\0';
        puzzle_output[9] = '\0';
        puzzle_output[10] = '\0';
        puzzle_output[0xb] = '\0';
        puzzle_output[0xc] = '\0';
        puzzle_output[0xd] = '\0';
        puzzle_output[0xe] = '\0';
        puzzle_output[0xf] = '\0';
        puzzle_output[0x10] = '\0';
        puzzle_output[0x11] = '\0';
        puzzle_output[0x12] = '\0';
        puzzle_output[0x13] = '\0';
        puzzle_output[0x14] = '\0';
        puzzle_output[0x15] = '\0';
        puzzle_output[0x16] = '\0';
        puzzle_output[0x17] = '\0';
        puzzle_output[0x18] = '\0';
        puzzle_output[0x19] = '\0';
        puzzle_output[0x1a] = '\0';
        puzzle_output[0x1b] = '\0';
        puzzle_output[0x1c] = '\0';
        puzzle_output[0x1d] = '\0';
        puzzle_output[0x1e] = '\0';
        puzzle_output[0x1f] = '\0';
        puzzle_output[0x20] = '\0';
        puzzle_output[0x21] = '\0';
        puzzle_output[0x22] = '\0';
        puzzle_output[0x23] = '\0';
        puzzle_output[0x24] = '\0';
        puzzle_output[0x25] = '\0';
        puzzle_output[0x26] = '\0';
        puzzle_output[0x27] = '\0';
        puzzle_output[0x28] = '\0';
        puzzle_output[0x29] = '\0';
        puzzle_output[0x2a] = '\0';
        puzzle_output[0x2b] = '\0';
        puzzle_output[0x2c] = '\0';
        puzzle_output[0x2d] = '\0';
        puzzle_output[0x2e] = '\0';
        puzzle_output[0x2f] = '\0';
        puzzle_output[0x30] = '\0';
        puzzle_output[0x31] = '\0';
        puzzle_output[0x32] = '\0';
        puzzle_output[0x33] = '\0';
        puzzle_output[0x34] = '\0';
        puzzle_output[0x35] = '\0';
        puzzle_output[0x36] = '\0';
        puzzle_output[0x37] = '\0';
        puzzle_output[0x38] = '\0';
        puzzle_output[0x39] = '\0';
        puzzle_output[0x3a] = '\0';
        puzzle_output[0x3b] = '\0';
        puzzle_output[0x3c] = '\0';
        puzzle_output[0x3d] = '\0';
        puzzle_output[0x3e] = '\0';
        puzzle_output[0x3f] = '\0';
        auVar36 = ZEXT1664(in_ZMM2._0_16_);
        lVar16 = std::chrono::_V2::steady_clock::now();
        auVar35 = auVar36._0_16_;
        dVar34 = NAN;
        lVar16 = SUB168(SEXT816(lVar16) * SEXT816(-0x20c49ba5e353f7cf),8);
        if (0 < (this->options_).min_seconds_warmup) {
          iVar27 = 0;
          pcVar32 = (char *)((lVar16 >> 7) - (lVar16 >> 0x3f));
          while( true ) {
            auVar35 = auVar36._0_16_;
            sVar18 = this->puzzle_buf_size_;
            uVar14 = Util::RandomUInt(this_00);
            pcVar31 = (this->dataset_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start +
                      ((ulong)uVar14 % (this->options_).test_dataset_size) * sVar18;
            puzzle_output[0] = '.';
            sVar18 = (*pSVar24->solve_)(pcVar31,1,pSVar24->configuration_,puzzle_output,
                                        (size_t *)local_4f8);
            if (this->allow_zero_ == false) break;
LAB_00104c49:
            iVar27 = iVar27 + 1;
            auVar36 = ZEXT1664(auVar35);
            lVar16 = std::chrono::_V2::steady_clock::now();
            auVar35 = auVar36._0_16_;
            lVar25 = (long)(this->options_).min_seconds_warmup;
            pcVar31 = pcVar32 + lVar16 / 1000;
            if (SBORROW8((long)pcVar31,lVar25 * 1000000) == (long)(pcVar31 + lVar25 * -1000000) < 0)
            {
              dVar34 = ((double)iVar27 * 1000000.0) / (double)(long)pcVar31;
              goto LAB_00104c9a;
            }
          }
          if (sVar18 != 0) {
            if (((this->options_).validate != true) || (pSVar24->returns_solution_ != true))
            goto LAB_00104c49;
            pcVar19 = puzzle_output;
            uVar28 = 0;
            uStack_3f8 = 0;
            uStack_3f4 = 0;
            uStack_3ec = 0;
            uStack_3e4 = 0;
            uStack_3dc = 0;
            uStack_3d4 = 0;
            _file = 0;
            uStack_430 = 0;
            uStack_428 = 0;
            uStack_420 = 0;
            uStack_418 = 0;
            uStack_410 = 0;
            uStack_40c = 0;
            uStack_408 = 0;
            uStack_404 = 0;
            uStack_400 = 0;
            uStack_3fc = 0;
            do {
              lVar16 = 0;
              do {
                uVar13 = 1 << ((byte)(pcVar19[lVar16] - 0x31) & 0x1f);
                *(uint *)(&file + uVar28 * 4) = *(uint *)(&file + uVar28 * 4) ^ uVar13;
                puVar1 = (uint *)((long)&uStack_418 + lVar16 * 4 + 4);
                *puVar1 = *puVar1 ^ uVar13;
                *(uint *)(&file + (long)(int)(((uint)lVar16 & 0xff) / 3 +
                                             (int)((uVar28 & 0xffffffff) / 3) * 3 + 0x12) * 4) =
                     *(uint *)(&file + (long)(int)(((uint)lVar16 & 0xff) / 3 +
                                                  (int)((uVar28 & 0xffffffff) / 3) * 3 + 0x12) * 4)
                     ^ uVar13;
                lVar16 = lVar16 + 1;
              } while (lVar16 != 9);
              uVar28 = uVar28 + 1;
              pcVar19 = pcVar19 + 9;
            } while (uVar28 != 9);
            uVar28 = 7;
            piVar20 = (int *)&uStack_430;
            do {
              if (piVar20[-2] != 0x1ff) {
                piVar20 = piVar20 + -2;
                goto LAB_00104c38;
              }
              if (piVar20[-1] != 0x1ff) {
                piVar20 = piVar20 + -1;
                goto LAB_00104c38;
              }
              if (*piVar20 != 0x1ff) goto LAB_00104c38;
              if (piVar20[1] != 0x1ff) {
                piVar20 = piVar20 + 1;
                goto LAB_00104c38;
              }
              uVar28 = uVar28 - 1;
              piVar20 = piVar20 + 4;
            } while (1 < uVar28);
            if ((uStack_3dc._4_4_ == 0x1ff) && ((int)uStack_3d4 == 0x1ff)) {
              piVar20 = (int *)((long)&uStack_3d4 + 4);
              if (uStack_3d4._4_4_ == 0x1ff) {
                piVar20 = local_3cc;
              }
LAB_00104c38:
              if (piVar20 == local_3cc) goto LAB_00104c49;
            }
          }
LAB_001050dd:
          ExitError(this,pcVar31,"warmup");
LAB_001050f2:
          ExitError(this,pcVar32,"benchmark");
          goto LAB_00105104;
        }
LAB_00104c9a:
        dVar34 = dVar34 * (double)(this->options_).min_seconds_test;
        auVar9._8_8_ = in_XMM6_Qb;
        auVar9._0_8_ = in_XMM6_Qa;
        auVar9 = vcvtusi2sd_avx512f(auVar9,(this->options_).test_dataset_size);
        puzzle_output[0x40] = '\0';
        puzzle_output[0x41] = '\0';
        puzzle_output[0x42] = '\0';
        puzzle_output[0x43] = '\0';
        puzzle_output[0x44] = '\0';
        puzzle_output[0x45] = '\0';
        puzzle_output[0x46] = '\0';
        puzzle_output[0x47] = '\0';
        puzzle_output[0x48] = '\0';
        puzzle_output[0x49] = '\0';
        puzzle_output[0x4a] = '\0';
        puzzle_output[0x4b] = '\0';
        puzzle_output[0x4c] = '\0';
        puzzle_output[0x4d] = '\0';
        puzzle_output[0x4e] = '\0';
        puzzle_output[0x4f] = '\0';
        puzzle_output[0x50] = '\0';
        puzzle_output[0] = '\0';
        puzzle_output[1] = '\0';
        puzzle_output[2] = '\0';
        puzzle_output[3] = '\0';
        puzzle_output[4] = '\0';
        puzzle_output[5] = '\0';
        puzzle_output[6] = '\0';
        puzzle_output[7] = '\0';
        puzzle_output[8] = '\0';
        puzzle_output[9] = '\0';
        puzzle_output[10] = '\0';
        puzzle_output[0xb] = '\0';
        puzzle_output[0xc] = '\0';
        puzzle_output[0xd] = '\0';
        puzzle_output[0xe] = '\0';
        puzzle_output[0xf] = '\0';
        puzzle_output[0x10] = '\0';
        puzzle_output[0x11] = '\0';
        puzzle_output[0x12] = '\0';
        puzzle_output[0x13] = '\0';
        puzzle_output[0x14] = '\0';
        puzzle_output[0x15] = '\0';
        puzzle_output[0x16] = '\0';
        puzzle_output[0x17] = '\0';
        puzzle_output[0x18] = '\0';
        puzzle_output[0x19] = '\0';
        puzzle_output[0x1a] = '\0';
        puzzle_output[0x1b] = '\0';
        puzzle_output[0x1c] = '\0';
        puzzle_output[0x1d] = '\0';
        puzzle_output[0x1e] = '\0';
        puzzle_output[0x1f] = '\0';
        puzzle_output[0x20] = '\0';
        puzzle_output[0x21] = '\0';
        puzzle_output[0x22] = '\0';
        puzzle_output[0x23] = '\0';
        puzzle_output[0x24] = '\0';
        puzzle_output[0x25] = '\0';
        puzzle_output[0x26] = '\0';
        puzzle_output[0x27] = '\0';
        puzzle_output[0x28] = '\0';
        puzzle_output[0x29] = '\0';
        puzzle_output[0x2a] = '\0';
        puzzle_output[0x2b] = '\0';
        puzzle_output[0x2c] = '\0';
        puzzle_output[0x2d] = '\0';
        puzzle_output[0x2e] = '\0';
        puzzle_output[0x2f] = '\0';
        puzzle_output[0x30] = '\0';
        puzzle_output[0x31] = '\0';
        puzzle_output[0x32] = '\0';
        puzzle_output[0x33] = '\0';
        puzzle_output[0x34] = '\0';
        puzzle_output[0x35] = '\0';
        puzzle_output[0x36] = '\0';
        puzzle_output[0x37] = '\0';
        puzzle_output[0x38] = '\0';
        puzzle_output[0x39] = '\0';
        puzzle_output[0x3a] = '\0';
        puzzle_output[0x3b] = '\0';
        puzzle_output[0x3c] = '\0';
        puzzle_output[0x3d] = '\0';
        puzzle_output[0x3e] = '\0';
        puzzle_output[0x3f] = '\0';
        auVar36 = ZEXT1664(auVar35);
        lVar16 = std::chrono::_V2::steady_clock::now();
        auVar35 = auVar36._0_16_;
        lVar16 = lVar16 / 1000;
        iVar27 = (this->options_).min_seconds_test;
        if (dVar34 + dVar34 <= auVar9._0_8_) {
          if (iVar27 < 1) goto LAB_00104e9c;
          pcVar31 = (char *)0x0;
          lVar25 = 0;
          uVar28 = 0;
          do {
            pcVar32 = (this->dataset_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start +
                      (long)perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start
                            [uVar28 % (this->options_).test_dataset_size] * this->puzzle_buf_size_;
            sVar22 = (*pSVar24->solve_)(pcVar32,2 - (ulong)(this->options_).first_solution,
                                        pSVar24->configuration_,puzzle_output,&puzzle_guesses);
            sVar18 = puzzle_guesses;
            if ((sVar22 == 0) && (this->allow_zero_ == false)) goto LAB_001050f2;
            lVar21 = std::chrono::_V2::steady_clock::now();
            auVar35 = auVar36._0_16_;
            lVar29 = (long)(this->options_).min_seconds_test;
            lVar21 = lVar21 / 1000;
            uVar28 = uVar28 + 1;
            lVar25 = lVar25 + (ulong)(sVar18 == 0);
            pcVar31 = pcVar31 + sVar18;
          } while (SBORROW8(lVar21 - lVar16,lVar29 * 2000000) !=
                   (lVar21 - lVar16) + lVar29 * -2000000 < 0);
        }
        else if (iVar27 < 1) {
LAB_00104e9c:
          uVar28 = 0;
          lVar25 = 0;
          pcVar31 = (char *)0x0;
          lVar21 = lVar16;
        }
        else {
          pcVar31 = (char *)0x0;
          lVar25 = 0;
          uVar28 = 0;
          do {
            if ((this->options_).test_dataset_size == 0) {
              uVar26 = 0;
            }
            else {
              uVar33 = 0;
              do {
                pcVar32 = (this->dataset_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start + this->puzzle_buf_size_ * uVar33;
                sVar18 = (*pSVar24->solve_)(pcVar32,2 - (ulong)(this->options_).first_solution,
                                            pSVar24->configuration_,puzzle_output,&puzzle_guesses);
                if ((sVar18 == 0) && (this->allow_zero_ == false)) {
                  ExitError(this,pcVar32,"benchmark");
                  goto LAB_001050dd;
                }
                pcVar31 = pcVar31 + puzzle_guesses;
                uVar26 = (this->options_).test_dataset_size;
                lVar25 = lVar25 + (ulong)(puzzle_guesses == 0);
                uVar33 = uVar33 + 1;
              } while (uVar33 < uVar26);
            }
            uVar28 = uVar28 + uVar26;
            lVar21 = std::chrono::_V2::steady_clock::now();
            auVar35 = auVar36._0_16_;
            lVar29 = (long)(this->options_).min_seconds_test;
            lVar21 = lVar21 / 1000;
          } while (SBORROW8(lVar21 - lVar16,lVar29 * 1000000) !=
                   (lVar21 - lVar16) + lVar29 * -1000000 < 0);
        }
        setlocale(1,"");
        bVar2 = (this->options_).csv_output;
        local_4f8[0] = local_4e8;
        pcVar7 = (filename->_M_dataplus)._M_p;
        bVar3 = pSVar24->returns_guess_count_;
        pcVar8 = (pSVar24->name_)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_4f8,pcVar8,pcVar8 + (pSVar24->name_)._M_string_length);
        plVar11 = local_4f8[0];
        local_458[0] = local_448;
        pcVar8 = (pSVar24->desc_)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_458,pcVar8,pcVar8 + (pSVar24->desc_)._M_string_length);
        pcVar32 = "%s,%s,%s,%s,%s%.0s,%f,%f,N/A,N/A";
        pcVar19 = "%.0s%.0s%.0s%.0s|%-27s%-11s|%\'12.1f |%\'12.1f |        N/A |            N/A |";
        if ((bVar3 & 1U) != 0) {
          pcVar32 = "%s,%s,%s,%s,%s%.0s,%f,%f,%f,%f";
          pcVar19 = "%.0s%.0s%.0s%.0s|%-27s%-11s|%\'12.1f |%\'12.1f |%10.1f%% |%\'15.2f |";
        }
        if (bVar2 != false) {
          pcVar19 = pcVar32;
        }
        auVar9 = vcvtusi2sd_avx512f(auVar35,pcVar31);
        auVar10 = vcvtusi2sd_avx512f(auVar35,uVar28);
        dVar37 = auVar10._0_8_;
        auVar10 = vcvtusi2sd_avx512f(auVar35,lVar25 * 100);
        auVar35 = vcvtusi2sd_avx512f(auVar35,uVar28 * 1000000);
        dVar34 = auVar10._0_8_ / dVar37;
        in_ZMM2 = ZEXT1664(CONCAT88(auVar10._8_8_,dVar34));
        snprintf((char *)&file,0x400,pcVar19,auVar35._0_8_ / (double)(lVar21 - lVar16),
                 (double)(lVar21 - lVar16) / dVar37,dVar34,auVar9._0_8_ / dVar37,"Clang","19.1.5",
                 "-O3 -O3  -march=native",pcVar7,plVar11,local_458[0]);
        if (local_458[0] != local_448) {
          operator_delete(local_458[0],local_448[0] + 1);
        }
        if (local_4f8[0] != local_4e8) {
          operator_delete(local_4f8[0],local_4e8[0] + 1);
        }
        sVar23 = strlen((char *)&file);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)&file,sVar23);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
        std::ostream::put('0');
        std::ostream::flush();
        pSVar24 = pSVar24 + 1;
      } while( true );
    }
    if ((puzzle_output._8_8_ == 0) || (*(char *)puzzle_output._0_8_ == '#')) {
      lVar16 = std::__cxx11::string::find(puzzle_output,0x10b500,0);
      if (lVar16 != -1) {
        this->allow_zero_ = true;
      }
      goto LAB_0010468d;
    }
    if (*(char *)(puzzle_output._0_8_ + -1 + puzzle_output._8_8_) == '\r') {
      puzzle_output._8_8_ = puzzle_output._8_8_ + -1;
      *(undefined1 *)(puzzle_output._0_8_ + puzzle_output._8_8_) = 0;
    }
    if ((ulong)puzzle_output._8_8_ < this->puzzle_size_) goto LAB_0010468d;
    uVar13 = uVar13 + 1;
    if ((this->options_).test_dataset_size <= uVar28) {
      dVar34 = Util::RandomDouble(this_00);
      auVar35 = vcvtusi2sd_avx512f(in_ZMM3._0_16_,(this->options_).test_dataset_size);
      in_ZMM2 = ZEXT1664(CONCAT88(in_ZMM3._8_8_,(double)(int)uVar13));
      if (dVar34 < auVar35._0_8_ / (double)(int)uVar13) {
        uVar14 = Util::RandomUInt(this_00);
        pcVar32 = (this->dataset_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start +
                  ((ulong)uVar14 % (this->options_).test_dataset_size) * this->puzzle_buf_size_;
        strncpy(pcVar32,(char *)puzzle_output._0_8_,this->puzzle_size_);
        if ((this->options_).randomize == true) {
          Util::PermuteSudoku(this_00,pcVar32,(this->options_).pencilmark);
        }
      }
      goto LAB_0010468d;
    }
    pcVar32 = (this->dataset_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start + uVar28 * this->puzzle_buf_size_;
    strncpy(pcVar32,(char *)puzzle_output._0_8_,this->puzzle_size_);
    if ((this->options_).randomize == true) {
      Util::PermuteSudoku(this_00,pcVar32,(this->options_).pencilmark);
    }
    uVar28 = (ulong)(uVar30 + 1);
  } while( true );
}

Assistant:

void Test(const string &filename) {
        if (options_.random_seed > 0) {
            util.RandomSeed(options_.random_seed);
        }
        Load(filename);
        OutputHeader(filename);

        // for the slow solvers we'll solve puzzles in this order to avoid any difficulty biases.
        auto perm = util.Permutation(options_.test_dataset_size);

        for (const Solver &solver : options_.solvers) {
            double puzzles_per_second = WarmupAndEstimateRate(solver);
            // we'll use the procedure for fast solvers if we expect to complete a full pass through
            // the data set in less than twice the min test time (or really less than up to 4x the min
            // test time since warmup is run with a limit of 1).
            bool fast = puzzles_per_second * options_.min_seconds_test * 2 > options_.test_dataset_size;

            char puzzle_output[81]{0};
            size_t puzzle_guesses;
            size_t total_guesses = 0;
            size_t total_no_guess = 0;
            size_t total_solved = 0;

            microseconds start = duration_cast<microseconds>(steady_clock::now().time_since_epoch());
            microseconds end = start;

            if (fast) {
                while ((end - start).count() < options_.min_seconds_test * 1000000) {
                    for (int i = 0; i < options_.test_dataset_size; i++) {
                        const char *puzzle = &dataset_[puzzle_buf_size_ * i];
                        size_t solutions = solver.Solve(puzzle, options_.first_solution ? 1 : 2,
                                                        puzzle_output, &puzzle_guesses);
                        if (!allow_zero_ && !solutions) {
                            ExitError(puzzle, "benchmark");
                        }
                        total_guesses += puzzle_guesses;
                        total_no_guess += (puzzle_guesses == 0);
                    }
                    total_solved += options_.test_dataset_size;
                    end = duration_cast<microseconds>(steady_clock::now().time_since_epoch());
                }
            } else {
                while ((end - start).count() < options_.min_seconds_test * 2000000) {
                    const char *puzzle = &dataset_[puzzle_buf_size_ * perm[total_solved % options_.test_dataset_size]];
                    size_t solutions = solver.Solve(puzzle, options_.first_solution ? 1 : 2,
                                                    puzzle_output, &puzzle_guesses);
                    if (!allow_zero_ && !solutions) {
                        ExitError(puzzle, "benchmark");
                    }
                    total_guesses += puzzle_guesses;
                    total_no_guess += (puzzle_guesses == 0);
                    total_solved += 1;
                    end = duration_cast<microseconds>(steady_clock::now().time_since_epoch());
                }
            }

            auto total_usec = (end - start).count();
            OutputResult(solver, filename, total_solved, total_usec, total_guesses, total_no_guess);
        }
    }